

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage_module.h
# Opt level: O3

void __thiscall
shift_window_transformer::StageModule<float>::StageModule
          (StageModule<float> *this,int in_channels,int hidden_dimension,int layers_cnt,
          int downscaling_factor,int num_heads,int head_dim,int window_size,
          bool relative_pos_embedding)

{
  pointer *pppSVar1;
  SwinBlock<float> *pSVar2;
  iterator iVar3;
  int iVar4;
  SwinBlock<float> *ptr2;
  SwinBlock<float> *ptr1;
  Linear<float> *local_38;
  
  (this->super_Layer<float>)._vptr_Layer = (_func_int **)&PTR_forward_0010ba28;
  (this->patch_partition).super_Layer<float>._vptr_Layer = (_func_int **)&PTR_forward_0010bbb0;
  local_38 = &(this->patch_partition).layer;
  Linear<float>::Linear
            (local_38,downscaling_factor * in_channels * downscaling_factor,hidden_dimension,true);
  (this->patch_partition).in_channels = in_channels;
  (this->patch_partition).out_channels = hidden_dimension;
  (this->patch_partition).downscaling_factor = downscaling_factor;
  (this->layers).
  super__Vector_base<shift_window_transformer::SwinBlock<float>_*,_std::allocator<shift_window_transformer::SwinBlock<float>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->layers).
  super__Vector_base<shift_window_transformer::SwinBlock<float>_*,_std::allocator<shift_window_transformer::SwinBlock<float>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->layers).
  super__Vector_base<shift_window_transformer::SwinBlock<float>_*,_std::allocator<shift_window_transformer::SwinBlock<float>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((layers_cnt & 1U) == 0) {
    if (0 < layers_cnt) {
      iVar4 = 0;
      do {
        pSVar2 = (SwinBlock<float> *)operator_new(0x38);
        SwinBlock<float>::SwinBlock
                  (pSVar2,hidden_dimension,num_heads,head_dim,hidden_dimension * 4,false,window_size
                   ,relative_pos_embedding);
        ptr1 = pSVar2;
        pSVar2 = (SwinBlock<float> *)operator_new(0x38);
        SwinBlock<float>::SwinBlock
                  (pSVar2,hidden_dimension,num_heads,head_dim,hidden_dimension * 4,true,window_size,
                   relative_pos_embedding);
        iVar3._M_current =
             (this->layers).
             super__Vector_base<shift_window_transformer::SwinBlock<float>_*,_std::allocator<shift_window_transformer::SwinBlock<float>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        ptr2 = pSVar2;
        if (iVar3._M_current ==
            (this->layers).
            super__Vector_base<shift_window_transformer::SwinBlock<float>_*,_std::allocator<shift_window_transformer::SwinBlock<float>_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<shift_window_transformer::SwinBlock<float>*,std::allocator<shift_window_transformer::SwinBlock<float>*>>
          ::_M_realloc_insert<shift_window_transformer::SwinBlock<float>*const&>
                    ((vector<shift_window_transformer::SwinBlock<float>*,std::allocator<shift_window_transformer::SwinBlock<float>*>>
                      *)&this->layers,iVar3,&ptr1);
          iVar3._M_current =
               (this->layers).
               super__Vector_base<shift_window_transformer::SwinBlock<float>_*,_std::allocator<shift_window_transformer::SwinBlock<float>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          *iVar3._M_current = ptr1;
          iVar3._M_current =
               (this->layers).
               super__Vector_base<shift_window_transformer::SwinBlock<float>_*,_std::allocator<shift_window_transformer::SwinBlock<float>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
          (this->layers).
          super__Vector_base<shift_window_transformer::SwinBlock<float>_*,_std::allocator<shift_window_transformer::SwinBlock<float>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current;
        }
        if (iVar3._M_current ==
            (this->layers).
            super__Vector_base<shift_window_transformer::SwinBlock<float>_*,_std::allocator<shift_window_transformer::SwinBlock<float>_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<shift_window_transformer::SwinBlock<float>*,std::allocator<shift_window_transformer::SwinBlock<float>*>>
          ::_M_realloc_insert<shift_window_transformer::SwinBlock<float>*const&>
                    ((vector<shift_window_transformer::SwinBlock<float>*,std::allocator<shift_window_transformer::SwinBlock<float>*>>
                      *)&this->layers,iVar3,&ptr2);
        }
        else {
          *iVar3._M_current = ptr2;
          pppSVar1 = &(this->layers).
                      super__Vector_base<shift_window_transformer::SwinBlock<float>_*,_std::allocator<shift_window_transformer::SwinBlock<float>_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppSVar1 = *pppSVar1 + 1;
        }
        iVar4 = iVar4 + 2;
      } while (iVar4 < layers_cnt);
    }
    return;
  }
  __assert_fail("layers_cnt % 2 == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dianhsu[P]swin-transformer-cpp/model/stage_module.h"
                ,0x16,
                "shift_window_transformer::StageModule<float>::StageModule(int, int, int, int, int, int, int, bool) [T = float]"
               );
}

Assistant:

StageModule(int in_channels, int hidden_dimension, int layers_cnt, int downscaling_factor, int num_heads,
                    int head_dim, int window_size, bool relative_pos_embedding) : patch_partition(in_channels,
                                                                                                  hidden_dimension,
                                                                                                  downscaling_factor) {
            assert(layers_cnt % 2 == 0);

            for (int i = 0; i < layers_cnt; i += 2) {
                auto ptr1 = new SwinBlock<T>(hidden_dimension, num_heads, head_dim, hidden_dimension * 4, false,
                                             window_size,
                                             relative_pos_embedding);
                auto ptr2 = new SwinBlock<T>(hidden_dimension, num_heads, head_dim, hidden_dimension * 4, true,
                                             window_size,
                                             relative_pos_embedding);
                layers.push_back(ptr1);
                layers.push_back(ptr2);
            }
        }